

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void units::removeOuterParenthesis(string *ustring)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  size_t ii;
  
  while( true ) {
    while( true ) {
      pcVar2 = (ustring->_M_dataplus)._M_p;
      if (*pcVar2 != '(') {
        return;
      }
      if (pcVar2[ustring->_M_string_length - 1] != ')') {
        return;
      }
      uVar3 = std::__cxx11::string::find((char)ustring,0x29);
      uVar4 = ustring->_M_string_length - 1;
      if (uVar3 != uVar4) break;
      std::__cxx11::string::pop_back();
      std::__cxx11::string::erase(ustring,(ustring->_M_dataplus)._M_p);
      if (ustring->_M_string_length == 0) {
        return;
      }
    }
    iVar5 = 1;
    for (uVar3 = 1; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      cVar1 = (ustring->_M_dataplus)._M_p[uVar3];
      if (cVar1 == ')') {
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          return;
        }
      }
      else {
        iVar5 = iVar5 + (uint)(cVar1 == '(');
      }
    }
    if (iVar5 != 1) break;
    std::__cxx11::string::pop_back();
    std::__cxx11::string::erase(ustring,(ustring->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

static void removeOuterParenthesis(std::string& ustring)
{
    while (ustring.front() == '(' && ustring.back() == ')') {
        // simple case
        if (ustring.find_first_of(')', 1) == ustring.size() - 1) {
            ustring.pop_back();
            ustring.erase(ustring.begin());
            if (ustring.empty()) {
                return;
            }
            continue;
        }
        int open = 1;
        for (size_t ii = 1; ii < ustring.size() - 1; ++ii) {
            if (ustring[ii] == '(') {
                ++open;
            }
            if (ustring[ii] == ')') {
                --open;
                if (open == 0) {
                    return;
                }
            }
        }
        if (open == 1) {
            ustring.pop_back();
            ustring.erase(ustring.begin());
        } else {
            return;
        }
    }
}